

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int ffi_index_meta(lua_State *L,CTState *cts,CType *ct,MMS mm)

{
  uint uVar1;
  int iVar2;
  cTValue *pcVar3;
  GCstr *pGVar4;
  TValue *pTVar5;
  int in_ECX;
  long in_RDX;
  long *in_RSI;
  lua_State *in_RDI;
  TValue *o_1;
  cTValue *o;
  char *key;
  char *s;
  TValue *base;
  cTValue *tv;
  CTypeID id;
  GCstr *in_stack_00000138;
  CTypeID in_stack_00000144;
  lua_State *in_stack_00000148;
  uint local_f8;
  uint local_f4;
  GCstr *local_f0;
  undefined8 in_stack_ffffffffffffff20;
  CTState *in_stack_ffffffffffffff28;
  cTValue *k;
  
  uVar1 = (uint)(in_RDX - *in_RSI >> 4);
  pcVar3 = lj_ctype_meta(in_stack_ffffffffffffff28,
                         (CTypeID)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                         (MMS)in_stack_ffffffffffffff20);
  k = in_RDI->base;
  if (pcVar3 == (cTValue *)0x0) {
LAB_0013af85:
    pGVar4 = lj_ctype_repr(in_stack_00000148,in_stack_00000144,in_stack_00000138);
    if (*(int *)((long)in_RDI->base + 0xc) == -5) {
      lj_err_callerv(in_RDI,LJ_ERR_FFI_BADMEMBER,pGVar4 + 1,(ulong)in_RDI->base[1].u32.lo + 0x10);
    }
    if (*(int *)((long)in_RDI->base + 0xc) == -0xb) {
      local_f0 = lj_ctype_repr(in_stack_00000148,in_stack_00000144,in_stack_00000138);
      local_f0 = local_f0 + 1;
    }
    else {
      if (*(uint *)((long)in_RDI->base + 0xc) < 0xffff0000) {
        local_f4 = 0xd;
      }
      else {
        if (*(int *)((long)in_RDI->base + 0xc) >> 0xf == -2) {
          local_f8 = 3;
        }
        else {
          local_f8 = *(uint *)((long)in_RDI->base + 0xc) ^ 0xffffffff;
        }
        local_f4 = local_f8;
      }
      local_f0 = (GCstr *)lj_obj_itypename[local_f4];
    }
    lj_err_callerv(in_RDI,LJ_ERR_FFI_BADIDXW,pGVar4 + 1,local_f0);
  }
  if ((pcVar3->field_2).it != 0xfffffff7) {
    if (in_ECX == 0) {
      pcVar3 = lj_meta_tget((lua_State *)(ulong)uVar1,pcVar3,k);
      if (pcVar3 != (cTValue *)0x0) {
        if ((pcVar3->field_2).it != 0xffffffff) {
          in_RDI->top[-1] = *pcVar3;
          return 1;
        }
        goto LAB_0013af85;
      }
    }
    else {
      pTVar5 = lj_meta_tset((lua_State *)CONCAT44(in_ECX,uVar1),pcVar3,k);
      if (pTVar5 != (TValue *)0x0) {
        *pTVar5 = k[2];
        return 0;
      }
    }
    *k = *in_RDI->top;
    pcVar3 = in_RDI->top + -1;
  }
  iVar2 = lj_meta_tailcall(in_RDI,pcVar3);
  return iVar2;
}

Assistant:

static int ffi_index_meta(lua_State *L, CTState *cts, CType *ct, MMS mm)
{
  CTypeID id = ctype_typeid(cts, ct);
  cTValue *tv = lj_ctype_meta(cts, id, mm);
  TValue *base = L->base;
  if (!tv) {
    const char *s;
  err_index:
    s = strdata(lj_ctype_repr(L, id, NULL));
    if (tvisstr(L->base+1)) {
      lj_err_callerv(L, LJ_ERR_FFI_BADMEMBER, s, strVdata(L->base+1));
    } else {
      const char *key = tviscdata(L->base+1) ?
	strdata(lj_ctype_repr(L, cdataV(L->base+1)->ctypeid, NULL)) :
	lj_typename(L->base+1);
      lj_err_callerv(L, LJ_ERR_FFI_BADIDXW, s, key);
    }
  }
  if (!tvisfunc(tv)) {
    if (mm == MM_index) {
      cTValue *o = lj_meta_tget(L, tv, base+1);
      if (o) {
	if (tvisnil(o)) goto err_index;
	copyTV(L, L->top-1, o);
	return 1;
      }
    } else {
      TValue *o = lj_meta_tset(L, tv, base+1);
      if (o) {
	copyTV(L, o, base+2);
	return 0;
      }
    }
    copyTV(L, base, L->top);
    tv = L->top-1-LJ_FR2;
  }
  return lj_meta_tailcall(L, tv);
}